

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_connect(connectdata *conn,_Bool *done)

{
  CURLcode CVar1;
  
  *done = false;
  Curl_conncontrol(conn,0);
  (conn->proto).ftpc.pp.response_time = 1800000;
  (conn->proto).ftpc.pp.statemach_act = ftp_statemach_act;
  (conn->proto).ftpc.pp.endofresp = ftp_endofresp;
  (conn->proto).ftpc.pp.conn = conn;
  if ((conn->handler->flags & 1) != 0) {
    CVar1 = Curl_ssl_connect(conn,0);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  Curl_pp_init(&(conn->proto).ftpc.pp);
  (conn->proto).ftpc.state = FTP_WAIT220;
  CVar1 = ftp_multi_statemach(conn,done);
  return CVar1;
}

Assistant:

static CURLcode ftp_connect(struct connectdata *conn,
                                 bool *done) /* see description above */
{
  CURLcode result;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections on ftp */
  connkeep(conn, "FTP default");

  pp->response_time = RESP_TIMEOUT; /* set default response time-out */
  pp->statemach_act = ftp_statemach_act;
  pp->endofresp = ftp_endofresp;
  pp->conn = conn;

  if(conn->handler->flags & PROTOPT_SSL) {
    /* BLOCKING */
    result = Curl_ssl_connect(conn, FIRSTSOCKET);
    if(result)
      return result;
  }

  Curl_pp_init(pp); /* init the generic pingpong data */

  /* When we connect, we start in the state where we await the 220
     response */
  state(conn, FTP_WAIT220);

  result = ftp_multi_statemach(conn, done);

  return result;
}